

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tiles.cpp
# Opt level: O1

void __thiscall Tiles::Tiles(Tiles *this)

{
  int iVar1;
  TileType TVar2;
  
  iVar1 = rand();
  TVar2 = EMPTY;
  if ((uint)(iVar1 % 5) < EMPTY) {
    TVar2 = iVar1 % 5;
  }
  this->data = TVar2;
  return;
}

Assistant:

Tiles::Tiles()
{
	//Quick Test
	int switchCase = rand() % 5;

	switch(switchCase)
	{
		case 0:
			data = WATER;
			break;
		case 1:
			data = GRASS;
			break;
		case 2:
			data = PATH;
			break;
		case 3:
			data = MOUNTAIN;
			break;
		case 4:
			data = FOREST;
			break;
		default: data = EMPTY;
	}
	//data = WATER;
}